

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O2

void key_press_proc(Am_Object *self)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  undefined1 uVar7;
  ushort uVar8;
  ulong uVar9;
  Am_Object AVar10;
  char *pcVar11;
  Am_Point_List pl;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  float y1;
  float x1;
  Am_Input_Char startc;
  Am_Object inter;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  undefined1 local_18 [8];
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)self);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11b);
  Am_Input_Char::Am_Input_Char(&startc,pAVar5);
  cVar2 = Am_Input_Char::As_Char();
  switch(cVar2) {
  case 'N':
    Create_Bouncing_Button();
    goto LAB_001060b6;
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 't':
  case 'u':
    goto switchD_00105b62_caseD_4f;
  case 'V':
    pAVar5 = (Am_Value *)Am_Object::Get(0xe5c8,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    if ((6U >> (key_press_proc::dogvisibleanimationcnt & 0x1fU) & 1) == 0) {
      if ((0x18U >> (key_press_proc::dogvisibleanimationcnt & 0x1fU) & 1) == 0) {
        Am_Object::Set(0xe5e0,100,500);
        Am_Object::Set(0xe5e0,(Am_Value *)0x65,(ulong)&Am_No_Value);
        poVar6 = std::operator<<((ostream *)&std::cout,"setting visible to ");
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        pcVar11 = " from x=500 only ";
      }
      else {
        Am_Object::Set(0xe5e0,(Am_Value *)0x64,(ulong)&Am_No_Value);
        Am_Object::Set(0xe5e0,0x65,100);
        poVar6 = std::operator<<((ostream *)&std::cout,"setting visible to ");
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        pcVar11 = " from Y=100 only ";
      }
    }
    else {
      Am_Object::Set(0xe5e0,100,0xfffffc18);
      Am_Object::Set(0xe5e0,0x65,0xfffffc18);
      poVar6 = std::operator<<((ostream *)&std::cout,"setting visible to ");
      poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
      pcVar11 = " from -1000,-1000 ";
    }
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    key_press_proc::dogvisibleanimationcnt = (uint)key_press_proc::dogvisibleanimationcnt % 6 + 1;
    Am_Object::Set(0xe5c8,true,(ulong)!bVar3);
    goto LAB_001060b6;
  case 'a':
    uVar8 = 0xe4a0;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe4a0,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 'b':
    uVar8 = 0xe5d0;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe5d0,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 'c':
    uVar8 = 0xe5e8;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe5e8,0x107);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    uVar7 = 7;
    goto LAB_001060a4;
  case 'd':
    uVar8 = 0xe5d8;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe5d8,0xcc);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    goto LAB_00105fb3;
  case 'e':
    if (key_press_proc::walking == true) {
      Am_Object::Am_Object(&local_60,&anim7);
      Am_Abort_Interactor((Am_Object_Data *)&local_60,true);
      Am_Object::~Am_Object(&local_60);
      AVar10.data = (Am_Object_Data *)local_18;
      Am_Object::Am_Object((Am_Object *)AVar10.data,&change_pic_anim);
      Am_Abort_Animator(AVar10);
    }
    else {
      Am_Object::Am_Object(&local_68,&anim7);
      Am_Object::Am_Object(&local_70,(Am_Object *)&Am_No_Object);
      uVar1 = _Am_Default_Start_Char;
      Am_Object::Am_Object(&local_78,(Am_Object *)&Am_No_Object);
      Am_Start_Interactor((Am_Object_Data *)&local_68,(Am_Object_Data *)&local_70,
                          (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_78,0,0,true);
      Am_Object::~Am_Object(&local_78);
      Am_Object::~Am_Object(&local_70);
      Am_Object::~Am_Object(&local_68);
      AVar10.data = (Am_Object_Data *)local_20;
      Am_Object::Am_Object((Am_Object *)AVar10.data,&change_pic_anim);
      Am_Start_Animator(AVar10,(Am_Value *)&Am_No_Value,(Am_Value *)&Am_No_Value);
    }
    Am_Object::~Am_Object((Am_Object *)AVar10.data);
    key_press_proc::walking = (bool)(key_press_proc::walking ^ 1);
    goto LAB_001060b6;
  case 'f':
    uVar8 = 0xe4b8;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe4b8,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 'g':
    uVar8 = 0xe5c0;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe5c0,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 'h':
    uVar8 = 0xe4a8;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe4a8,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 'i':
    Am_Set_Inter_Trace(key_press_proc::debugging ^ Am_INTER_TRACE_ALL);
    key_press_proc::debugging = (bool)(key_press_proc::debugging ^ 1);
    goto LAB_001060b6;
  case 'm':
    pAVar5 = (Am_Value *)Am_Object::Get(0xe498,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    if ((6U >> (key_press_proc::visibleanimationcnt & 0x1fU) & 1) == 0) {
      if ((0x18U >> (key_press_proc::visibleanimationcnt & 0x1fU) & 1) == 0) {
        Am_Object::Set(0xe5b0,(Am_Value *)0x66,(ulong)&Am_No_Value);
        Am_Object::Set(0xe5b0,0x67,1);
        poVar6 = std::operator<<((ostream *)&std::cout," setting visible to ");
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        pcVar11 = " shrink in Y only";
      }
      else {
        Am_Object::Set(0xe5b0,0x66,1);
        Am_Object::Set(0xe5b0,(Am_Value *)0x67,(ulong)&Am_No_Value);
        poVar6 = std::operator<<((ostream *)&std::cout," setting visible to ");
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        pcVar11 = " shrink in X only";
      }
    }
    else {
      Am_Object::Set(0xe5b0,0x66,1);
      Am_Object::Set(0xe5b0,0x67,1);
      poVar6 = std::operator<<((ostream *)&std::cout," setting visible to ");
      poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
      pcVar11 = " in X and Y";
    }
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    key_press_proc::visibleanimationcnt = (uint)key_press_proc::visibleanimationcnt % 6 + 1;
    Am_Object::Set(0xe498,true,(ulong)!bVar3);
    goto LAB_001060b6;
  case 'o':
    uVar8 = 0xe5f0;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe5f0,0xcc);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
LAB_00105fb3:
    uVar7 = 0xcc;
    goto LAB_001060a4;
  case 'p':
    if ((key_press_proc(Am_Object)::copy_point_list == '\0') &&
       (iVar4 = __cxa_guard_acquire(&key_press_proc(Am_Object)::copy_point_list), iVar4 != 0)) {
      Am_Point_List::Am_Point_List((Am_Point_List *)key_press_proc(Am_Object)::copy_point_list);
      __cxa_atexit(Am_Point_List::~Am_Point_List,key_press_proc(Am_Object)::copy_point_list,
                   &__dso_handle);
      __cxa_guard_release(&key_press_proc(Am_Object)::copy_point_list);
    }
    pAVar5 = (Am_Value *)Am_Object::Get(0xe4e0,0xb2);
    Am_Point_List::Am_Point_List(&pl,pAVar5);
    (*(code *)((long)&DAT_0010a0bc +
              (long)(int)(&DAT_0010a0bc)[key_press_proc::polygonanimationcnt - 1]))();
    return;
  case 'q':
    Am_Exit_Main_Event_Loop();
    goto LAB_001060b6;
  case 'r':
    uVar8 = 0xe498;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe498,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 's':
    pAVar5 = (Am_Value *)Am_Object::Get(0xe498,100);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    if (iVar4 == 500) {
      Am_Object::Set(0xe498,100,0xaf);
      uVar9 = 0x7d;
    }
    else {
      uVar9 = 500;
      Am_Object::Set(0xe498,100,500);
    }
    Am_Object::Set(0xe498,0x65,uVar9);
    goto LAB_001060b6;
  case 'v':
    uVar8 = 0xe4c8;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe4c8,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  case 'w':
    uVar8 = 0xe4b0;
    pAVar5 = (Am_Value *)Am_Object::Get(0xe4b0,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar5);
    break;
  default:
    if (cVar2 == 'A') {
      if (key_press_proc::visblinking == true) {
        Am_Object::Am_Object(&local_80,&wiggler_vis_blink);
        Am_Abort_Animator((Am_Object_Data *)&local_80);
        Am_Object::~Am_Object(&local_80);
        Am_Object::Set(0xe4b0,true,1);
      }
      else {
        Am_Object::Am_Object(&local_88,&wiggler_vis_blink);
        Am_Start_Animator((Am_Object_Data *)&local_88,(Am_Value *)&Am_No_Value,
                          (Am_Value *)&Am_No_Value);
        Am_Object::~Am_Object(&local_88);
      }
      key_press_proc::visblinking = (bool)(key_press_proc::visblinking ^ 1);
      goto LAB_001060b6;
    }
    if (cVar2 == 'B') {
      if (key_press_proc::blinking == true) {
        AVar10.data = (Am_Object_Data *)local_28;
        Am_Object::Am_Object((Am_Object *)AVar10.data,&wiggler_blink);
        Am_Abort_Animator(AVar10);
      }
      else {
        AVar10.data = (Am_Object_Data *)local_30;
        Am_Object::Am_Object((Am_Object *)AVar10.data,&wiggler_blink);
        Am_Start_Animator(AVar10,(Am_Value *)&Am_No_Value,(Am_Value *)&Am_No_Value);
      }
      Am_Object::~Am_Object((Am_Object *)AVar10.data);
      key_press_proc::blinking = (bool)(key_press_proc::blinking ^ 1);
      goto LAB_001060b6;
    }
    goto switchD_00105b62_caseD_4f;
  }
  uVar7 = 0x69;
LAB_001060a4:
  Am_Object::Set(uVar8,(bool)uVar7,(ulong)(bVar3 ^ 1));
LAB_001060b6:
  Am_Object::~Am_Object(&inter);
  return;
switchD_00105b62_caseD_4f:
  poVar6 = std::operator<<((ostream *)&std::cout,"Commands:");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"a to toggle 2D animator");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"f to toggle fixed-time animator");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"h to toggle hopping animator");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"w to toggle wiggling animator");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"s to set red rectangle\'s left & top");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"c to toggle RGB and HSV color paths");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"r to hide red rectangle\n");
  poVar6 = std::operator<<(poVar6,"i = toggle interactor (animator) tracing\n");
  poVar6 = std::operator<<(poVar6,"m = grow visible animate rectangle\n");
  poVar6 = std::operator<<(poVar6,"o = toggle animation on 1st option menu\n");
  poVar6 = std::operator<<(poVar6,"p = test polygon animation\n");
  poVar6 = std::operator<<(poVar6,"e = toggle eye walking");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"For icons:\n");
  poVar6 = std::operator<<(poVar6,"   g = toggle girl\n");
  poVar6 = std::operator<<(poVar6,"   d = toggle dog animation\n");
  poVar6 = std::operator<<(poVar6,"   b = toggle bug\n");
  poVar6 = std::operator<<(poVar6,"   v = toggle visible on group (fade out)\n");
  poVar6 = std::operator<<(poVar6,"   V = toggle visible on dog (fly away)\n");
  poVar6 = std::operator<<(poVar6," A = blink wiggler visible\n");
  poVar6 = std::operator<<(poVar6," B = blink wiggler blue and green\n");
  poVar6 = std::operator<<(poVar6," N = create new window with animated button\n");
  poVar6 = std::operator<<(poVar6,"q to quit");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::ostream::flush();
  goto LAB_001060b6;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char startc = inter.Get(Am_START_CHAR);
  int c = startc.As_Char();

  if (c == 'q')
    Am_Exit_Main_Event_Loop();
  else if (c == 's') {
    if ((int)Mover.Get(Am_LEFT) == 500) {
      Mover.Set(Am_LEFT, 175);
      Mover.Set(Am_TOP, 125);
    } else {
      Mover.Set(Am_LEFT, 500);
      Mover.Set(Am_TOP, 500);
    }
  } else if (c == 'a')
    Animator.Set(Am_VISIBLE, !(bool)Animator.Get(Am_VISIBLE));
  else if (c == 'f')
    fixed_time.Set(Am_VISIBLE, !(bool)fixed_time.Get(Am_VISIBLE));
  else if (c == 'h')
    hopper.Set(Am_VISIBLE, !(bool)hopper.Get(Am_VISIBLE));
  else if (c == 'w')
    wiggler.Set(Am_VISIBLE, !(bool)wiggler.Get(Am_VISIBLE));
  else if (c == 'e') {
    static bool walking = true;
    if (walking) {
      Am_Abort_Interactor(anim7);
      Am_Abort_Animator(change_pic_anim);
    } else {
      Am_Start_Interactor(anim7);
      Am_Start_Animator(change_pic_anim);
    }
    walking = !walking;
  } else if (c == 'c')
    coloranimation.Set(Am_RGB_COLOR, !(bool)coloranimation.Get(Am_RGB_COLOR));
  else if (c == 'N')
    Create_Bouncing_Button();
  else if (c == 'B') {
    static bool blinking = false;
    if (blinking) {
      Am_Abort_Animator(wiggler_blink);
    } else {
      Am_Start_Animator(wiggler_blink);
    }
    blinking = !blinking;
  } else if (c == 'A') {
    static bool visblinking = false;
    if (visblinking) {
      Am_Abort_Animator(wiggler_vis_blink);
      wiggler.Set(Am_VISIBLE, true); //might stop with it invisible
    } else {
      Am_Start_Animator(wiggler_vis_blink);
    }
    visblinking = !visblinking;
  } else if (c == 'r')
    Mover.Set(Am_VISIBLE, !(bool)Mover.Get(Am_VISIBLE));
  else if (c == 'i') {
    static bool debugging = false;
    if (!debugging)
      Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    else
      Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    debugging = !debugging;
  } else if (c == 'm') {
    static int visibleanimationcnt = 1;
    bool new_visible = !(bool)Mover.Get(Am_VISIBLE);
    switch (visibleanimationcnt) {
    case 1:
    case 2:
      rectvisibleanimation.Set(Am_WIDTH, 1);
      rectvisibleanimation.Set(Am_HEIGHT, 1);
      std::cout << " setting visible to " << new_visible << " in X and Y"
                << std::endl
                << std::flush;
      break;
    case 3:
    case 4:
      rectvisibleanimation.Set(Am_WIDTH, 1);
      rectvisibleanimation.Set(Am_HEIGHT, Am_No_Value);
      std::cout << " setting visible to " << new_visible << " shrink in X only"
                << std::endl
                << std::flush;
      break;
    case 5:
    case 6:
      rectvisibleanimation.Set(Am_WIDTH, Am_No_Value);
      rectvisibleanimation.Set(Am_HEIGHT, 1);
      std::cout << " setting visible to " << new_visible << " shrink in Y only"
                << std::endl
                << std::flush;
      break;
    }
    visibleanimationcnt = (visibleanimationcnt % 6) + 1;
    Mover.Set(Am_VISIBLE, new_visible);
  }
#ifdef TESTUSEPIXMAPS
  else if (c == 'g')
    girl.Set(Am_VISIBLE, !(bool)girl.Get(Am_VISIBLE));
  else if (c == 'b')
    bug.Set(Am_VISIBLE, !(bool)bug.Get(Am_VISIBLE));
  else if (c == 'v')
    fade_group.Set(Am_VISIBLE, !(bool)fade_group.Get(Am_VISIBLE));
  else if (c == 'V') {
    static int dogvisibleanimationcnt = 1;
    bool new_visible = !(bool)dog.Get(Am_VISIBLE);
    switch (dogvisibleanimationcnt) {
    case 1:
    case 2:
      dogvisibleanimation.Set(Am_LEFT, -1000);
      dogvisibleanimation.Set(Am_TOP, -1000);
      std::cout << "setting visible to " << new_visible << " from -1000,-1000 "
                << std::endl
                << std::flush;
      break;
    case 3:
    case 4:
      dogvisibleanimation.Set(Am_LEFT, Am_No_Value);
      dogvisibleanimation.Set(Am_TOP, 100);
      std::cout << "setting visible to " << new_visible << " from Y=100 only "
                << std::endl
                << std::flush;
      break;
    case 5:
    case 6:
      dogvisibleanimation.Set(Am_LEFT, 500);
      dogvisibleanimation.Set(Am_TOP, Am_No_Value);
      std::cout << "setting visible to " << new_visible << " from x=500 only "
                << std::endl
                << std::flush;
      break;
    }
    dogvisibleanimationcnt = (dogvisibleanimationcnt % 6) + 1;
    dog.Set(Am_VISIBLE, new_visible);
  } else if (c == 'd')
    doganimation.Set(Am_ACTIVE, !(bool)doganimation.Get(Am_ACTIVE));
  else if (c == 'o')
    optionvisibleanimation.Set(Am_ACTIVE,
                               !(bool)optionvisibleanimation.Get(Am_ACTIVE));
#endif
  else if (c == 'p') {
    static int polygonanimationcnt = 1;
    static Am_Point_List copy_point_list;
    Am_Point_List pl = polygon.Get(Am_POINT_LIST);

    float x1, y1;
    switch (polygonanimationcnt) {
    case 1: {
      std::cout << "<><>Adding new point to polygon old = " << pl;
      pl.Start();
      pl.Next();
      pl.Next();
      pl.Get(x1, y1);
      pl.Insert(x1 - 25, y1 - 50, Am_AFTER);
      break;
    }
    case 2: {
      std::cout << "<><>Removing the new point from polygon old = " << pl;
      pl.Start();
      pl.Next();
      pl.Next();
      pl.Next();
      pl.Delete();
      break;
    }
    case 3: {
      std::cout << "<><>Point list to nothing; old = " << pl;
      pl = Am_Point_List(); // empty list
      break;
    }
    case 4: {
      std::cout << "<><>Point list from nothing; old = " << pl;
      pl = triangle_point_list;
      break;
    }
    case 5: {
      std::cout << "<><>Changing radically to be a star; old = " << pl;
      pl = star_point_list;
      break;
    }
    case 6: {
      std::cout << "<><>Back to triangle; old = " << pl;
      pl = triangle_point_list;
      break;
    }
    }
    polygonanimationcnt = (polygonanimationcnt % 6) + 1;
    std::cout << " new = " << pl << std::endl << std::flush;
    polygon.Set(Am_POINT_LIST, pl);
  } else
    std::cout << "Commands:" << std::endl
              << "a to toggle 2D animator" << std::endl
              << "f to toggle fixed-time animator" << std::endl
              << "h to toggle hopping animator" << std::endl
              << "w to toggle wiggling animator" << std::endl
              << "s to set red rectangle's left & top" << std::endl
              << "c to toggle RGB and HSV color paths" << std::endl
              << "r to hide red rectangle\n"
              << "i = toggle interactor (animator) tracing\n"
              << "m = grow visible animate rectangle\n"
              << "o = toggle animation on 1st option menu\n"
              << "p = test polygon animation\n"
              << "e = toggle eye walking" << std::endl
#ifdef TESTUSEPIXMAPS
              << "For icons:\n"
              << "   g = toggle girl\n"
              << "   d = toggle dog animation\n"
              << "   b = toggle bug\n"
              << "   v = toggle visible on group (fade out)\n"
              << "   V = toggle visible on dog (fly away)\n"
#endif
              << " A = blink wiggler visible\n"
              << " B = blink wiggler blue and green\n"
              << " N = create new window with animated button\n"
              << "q to quit" << std::endl
              << std::flush;
}